

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlBufferDetach(xmlBufferPtr buf)

{
  xmlChar *pxVar1;
  
  if ((buf != (xmlBufferPtr)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
    pxVar1 = buf->content;
    buf->content = (xmlChar *)0x0;
    buf->use = 0;
    buf->size = 0;
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlBufferDetach(xmlBufferPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(NULL);

    ret = buf->content;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;

    return ret;
}